

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::Btree_BtreeMapCanHoldNoDefaultCtorTypes_Test::TestBody
          (Btree_BtreeMapCanHoldNoDefaultCtorTypes_Test *this)

{
  undefined4 uVar1;
  node_type *pnVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pcVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  iterator iVar5;
  ScopedTrace gtest_trace_1498;
  undefined1 local_c0 [8];
  uint local_b8;
  undefined4 uStack_b4;
  undefined1 local_b0 [8];
  uint local_a8;
  undefined4 uStack_a4;
  undefined1 local_a0 [8];
  uint local_98;
  undefined4 uStack_94;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
  local_80;
  AssertHelper local_70;
  string local_68;
  btree_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_>
  local_48;
  
  local_48.tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*>
        )&btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>
          ::EmptyNode()::empty_node;
  local_48.tree_.rightmost_ =
       (node_type *)
       &btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>
        ::EmptyNode()::empty_node;
  local_48.tree_.size_ = 0;
  local_b0._0_4_ = 1;
  do {
    testing::ScopedTrace::ScopedTrace<int>
              ((ScopedTrace *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x5da,(int *)local_b0);
    btree_set_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>>
    ::
    emplace<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor>
              ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
                *)&local_68,&local_48,(NoDefaultCtor *)((ulong)local_b0 & 0xffffffff),
               (NoDefaultCtor *)(ulong)(100 - local_b0._0_4_));
    local_90[0] = (internal)local_68.field_2._M_local_buf[0];
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_68.field_2._M_local_buf[0] == '\0') {
      testing::Message::Message((Message *)local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)local_90,
                 (AssertionResult *)"m.emplace(NoDefaultCtor(i), NoDefaultCtor(100 - i)).second",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x5db,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                 local_68.field_2._M_local_buf[0]) + 1);
      }
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_80);
    uVar1 = local_b0._0_4_;
    local_b0._0_4_ = local_b0._0_4_ + 1;
  } while ((int)uVar1 < 99);
  btree_set_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>>
  ::
  emplace<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor>
            ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>,_bool>
              *)&local_68,&local_48,(NoDefaultCtor *)0x4e,(NoDefaultCtor *)0x0);
  local_90 = (undefined1  [8])(CONCAT71(local_90._1_7_,local_68.field_2._M_local_buf[0]) ^ 1);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_68.field_2._M_local_buf[0] != '\0') {
    testing::Message::Message((Message *)local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_90,
               (AssertionResult *)"m.emplace(NoDefaultCtor(78), NoDefaultCtor(0)).second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x5dd,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  local_90._0_4_ = 99;
  iVar5 = btree_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_>
          ::find<phmap::priv::(anonymous_namespace)::NoDefaultCtor>
                    (&local_48,
                     (key_arg<phmap::priv::(anonymous_namespace)::NoDefaultCtor> *)local_90);
  pnVar2 = local_48.tree_.rightmost_;
  local_68._M_dataplus._M_p = (pointer)iVar5.node;
  local_68._M_string_length._0_4_ = iVar5.position;
  if (((ulong)local_48.tree_.rightmost_ & 7) != 0) {
    pcVar4 = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>,..." /* TRUNCATED STRING LITERAL */
    ;
    goto LAB_001b50d7;
  }
  local_a0 = (undefined1  [8])local_48.tree_.rightmost_;
  local_98 = (uint)(byte)*(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                           *)((long)local_48.tree_.rightmost_ + 10);
  testing::internal::
  CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>>
            (local_90,"iter99",
             (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
              *)&local_68,
             (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
              *)local_a0);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a0);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x5e0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_a0 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
    __ptr_00 = local_88;
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_001b5081;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_88;
  }
  else {
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    if (((ulong)local_68._M_dataplus._M_p & 7) != 0) {
LAB_001b50c2:
      pcVar4 = 
      "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>, phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::Less<phmap::priv::(anonymous namespace)::NoDefaultCtor>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NoDefaultCtor, phmap::priv::(anonymous namespace)::NoDefaultCtor>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>,..." /* TRUNCATED STRING LITERAL */
      ;
LAB_001b50d7:
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xf84,pcVar4);
    }
    local_a0._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_90,"iter99->second.num","1",
               (int *)(local_68._M_dataplus._M_p + (long)(int)local_68._M_string_length * 8 + 0x10),
               (int *)local_a0);
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a0);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x5e1,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
      if (local_a0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_a0 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    local_a0._0_4_ = 1;
    iVar5 = btree_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_>
            ::find<phmap::priv::(anonymous_namespace)::NoDefaultCtor>
                      (&local_48,
                       (key_arg<phmap::priv::(anonymous_namespace)::NoDefaultCtor> *)local_a0);
    local_90 = (undefined1  [8])iVar5.node;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(local_88._4_4_,iVar5.position);
    local_c0 = (undefined1  [8])pnVar2;
    local_b8 = (uint)(byte)*(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                             *)((long)pnVar2 + 10);
    testing::internal::
    CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>>
              (local_a0,"iter1",
               (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
                *)local_90,
               (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
                *)local_c0);
    if (local_a0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c0);
      if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)CONCAT44(uStack_94,local_98);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x5e4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
      __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98);
      if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_001b5081;
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_98;
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,local_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,local_98));
      }
      if (((ulong)local_90 & 7) != 0) goto LAB_001b50c2;
      local_c0._0_4_ = 99;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_a0,"iter1->second.num","99",
                 (int *)((long)local_90 + (long)(int)local_88 * 8 + 0x10),(int *)local_c0);
      if (local_a0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)CONCAT44(uStack_94,local_98);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x5e5,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(uStack_94,local_98) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(uStack_94,local_98));
      }
      local_c0._0_4_ = 0x32;
      iVar5 = btree_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_>
              ::find<phmap::priv::(anonymous_namespace)::NoDefaultCtor>
                        (&local_48,
                         (key_arg<phmap::priv::(anonymous_namespace)::NoDefaultCtor> *)local_c0);
      local_a0 = (undefined1  [8])iVar5.node;
      local_98 = iVar5.position;
      local_b0 = (undefined1  [8])pnVar2;
      local_a8 = (uint)(byte)*(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                               *)((long)pnVar2 + 10);
      testing::internal::
      CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>>
                (local_c0,"iter50",
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
                  *)local_a0,
                 (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
                  *)local_b0);
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_b0);
        if ((undefined8 *)CONCAT44(uStack_b4,local_b8) == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)CONCAT44(uStack_b4,local_b8);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x5e8,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_b0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
        if (local_b0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_b0 + 8))();
        }
        __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_b4,local_b8);
        if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_001b5081;
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8;
      }
      else {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_b4,local_b8) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_b4,local_b8));
        }
        if (((ulong)local_a0 & 7) != 0) goto LAB_001b50c2;
        local_b0._0_4_ = 0x32;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_c0,"iter50->second.num","50",
                   (int *)((btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                            *)((long)local_a0 + (long)(int)local_98 * 8) + 0x10),(int *)local_b0);
        if (local_c0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_b0);
          if ((undefined8 *)CONCAT44(uStack_b4,local_b8) == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)CONCAT44(uStack_b4,local_b8);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x5e9,pcVar4);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_b0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if (local_b0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_b0 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(uStack_b4,local_b8) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uStack_b4,local_b8));
        }
        local_b0._0_4_ = 0x19;
        iVar5 = btree_container<phmap::priv::btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_>
                ::find<phmap::priv::(anonymous_namespace)::NoDefaultCtor>
                          (&local_48,
                           (key_arg<phmap::priv::(anonymous_namespace)::NoDefaultCtor> *)local_b0);
        local_c0 = (undefined1  [8])iVar5.node;
        local_b8 = iVar5.position;
        local_80.node = pnVar2;
        local_80.position =
             (int)(byte)*(btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                          *)((long)pnVar2 + 10);
        testing::internal::
        CmpHelperNE<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>,phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::priv::(anonymous_namespace)::NoDefaultCtor,phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>>,256,false>>,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>&,std::pair<phmap::priv::(anonymous_namespace)::NoDefaultCtor_const,phmap::priv::(anonymous_namespace)::NoDefaultCtor>*>>
                  (local_b0,"iter25",
                   (btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_&,_std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_*>
                    *)local_c0,&local_80);
        if (local_b0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_80);
          if ((undefined8 *)CONCAT44(uStack_a4,local_a8) == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)CONCAT44(uStack_a4,local_a8);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                     ,0x5ec,pcVar4);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
LAB_001b5053:
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_80.node !=
              (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
               *)0x0) {
            (**(code **)(*(long *)local_80.node + 8))();
          }
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(uStack_a4,local_a8) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(uStack_a4,local_a8));
          }
          if (((ulong)local_c0 & 7) != 0) goto LAB_001b50c2;
          local_80.node =
               (btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                *)CONCAT44(local_80.node._4_4_,0x4b);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_b0,"iter25->second.num","75",
                     (int *)((long)local_c0 + (long)(int)local_b8 * 8 + 0x10),(int *)&local_80);
          if (local_b0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_80);
            if ((undefined8 *)CONCAT44(uStack_a4,local_a8) == (undefined8 *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)CONCAT44(uStack_a4,local_a8);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                       ,0x5ed,pcVar4);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_80);
            goto LAB_001b5053;
          }
        }
        __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(uStack_a4,local_a8);
        if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_001b5081;
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8;
      }
    }
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_001b5081:
  if (local_48.tree_.size_ != 0) {
    btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
    ::internal_clear((btree<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>
                      *)local_48.tree_.root_.
                        super__Tuple_impl<0UL,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<1UL,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*>
                        .
                        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*>
                        .
                        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::Less<phmap::priv::(anonymous_namespace)::NoDefaultCtor>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NoDefaultCtor,_phmap::priv::(anonymous_namespace)::NoDefaultCtor>_>,_256,_false>_>_*,_false>
                        ._M_head_impl,(node_type *)__ptr_00);
  }
  return;
}

Assistant:

size_type count(const key_type &key) const {
        size_type res = checker_.count(key);
        EXPECT_EQ(res, tree_.count(key));
        return res;
    }